

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

void __thiscall KDIS::NETWORK::Connection::AddSubscriber(Connection *this,ConnectionSubscriber *S)

{
  pointer *pppCVar1;
  iterator __position;
  ConnectionSubscriber *local_8;
  
  if (S != (ConnectionSubscriber *)0x0) {
    __position._M_current =
         (this->m_vpSubscribers).
         super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_vpSubscribers).
        super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_8 = S;
      std::
      vector<KDIS::NETWORK::ConnectionSubscriber*,std::allocator<KDIS::NETWORK::ConnectionSubscriber*>>
      ::_M_realloc_insert<KDIS::NETWORK::ConnectionSubscriber*const&>
                ((vector<KDIS::NETWORK::ConnectionSubscriber*,std::allocator<KDIS::NETWORK::ConnectionSubscriber*>>
                  *)&this->m_vpSubscribers,__position,&local_8);
    }
    else {
      *__position._M_current = S;
      pppCVar1 = &(this->m_vpSubscribers).
                  super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
  }
  return;
}

Assistant:

void Connection::AddSubscriber( ConnectionSubscriber * S )
{
    if( S )
    {
        m_vpSubscribers.push_back( S );
    }
}